

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckScriptKeyboardAccessible(TidyDocImpl *doc,Node *node)

{
  TidyAttrId TVar1;
  AttVal *pAVar2;
  int iVar3;
  Node *node_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    pAVar2 = node->attributes;
    if (pAVar2 != (AttVal *)0x0) {
      iVar5 = 0;
      iVar6 = 0;
      iVar7 = 0;
      iVar3 = 0;
      iVar4 = 0;
      do {
        if (pAVar2->dict != (Attribute *)0x0) {
          TVar1 = pAVar2->dict->id;
          iVar4 = iVar4 + (uint)(TVar1 == TidyAttr_OnMOUSEOVER);
          iVar3 = iVar3 + (uint)(TVar1 == TidyAttr_OnMOUSEMOVE);
          iVar5 = iVar5 + (uint)(TVar1 == TidyAttr_OnMOUSEOUT) + (uint)(TVar1 == TidyAttr_OnBLUR);
          iVar6 = iVar6 + (uint)(TVar1 == TidyAttr_OnCLICK) + (uint)(TVar1 == TidyAttr_OnKEYPRESS);
          iVar7 = iVar7 + (uint)(TVar1 == TidyAttr_OnMOUSEDOWN) +
                  (uint)(TVar1 == TidyAttr_OnKEYDOWN);
        }
        pAVar2 = pAVar2->next;
      } while (pAVar2 != (AttVal *)0x0);
      if (iVar7 == 1) {
        prvTidyReportAccessError(doc,node,0x2ed);
      }
      if (iVar5 == 1) {
        prvTidyReportAccessError(doc,node,0x2ee);
      }
      if (iVar6 == 1) {
        prvTidyReportAccessError(doc,node,0x2ef);
      }
      if (iVar5 == 1) {
        prvTidyReportAccessError(doc,node,0x2f1);
      }
      if (iVar4 == 1) {
        prvTidyReportAccessError(doc,node,0x2f0);
      }
      if (iVar3 == 1) {
        prvTidyReportAccessError(doc,node,0x2f2);
      }
    }
    for (node_00 = node->content; node_00 != (Node *)0x0; node_00 = node_00->next) {
      CheckScriptKeyboardAccessible(doc,node_00);
    }
  }
  return;
}

Assistant:

static void CheckScriptKeyboardAccessible( TidyDocImpl* doc, Node* node )
{
    Node* content;
    int HasOnMouseDown = 0;
    int HasOnMouseUp = 0;
    int HasOnClick = 0;
    int HasOnMouseOut = 0;
    int HasOnMouseOver = 0;
    int HasOnMouseMove = 0;

    if (Level2_Enabled( doc ))
    {
        AttVal* av;
        /* Checks all elements for their attributes */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Must also have 'ONKEYDOWN' attribute with 'ONMOUSEDOWN' */
            if ( attrIsOnMOUSEDOWN(av) )
                HasOnMouseDown++;

            /* Must also have 'ONKEYUP' attribute with 'ONMOUSEUP' */
            if ( attrIsOnMOUSEUP(av) )
                HasOnMouseUp++;

            /* Must also have 'ONKEYPRESS' attribute with 'ONCLICK' */
            if ( attrIsOnCLICK(av) )
                HasOnClick++;

            /* Must also have 'ONBLUR' attribute with 'ONMOUSEOUT' */
            if ( attrIsOnMOUSEOUT(av) )
                HasOnMouseOut++;

            if ( attrIsOnMOUSEOVER(av) )
                HasOnMouseOver++;

            if ( attrIsOnMOUSEMOVE(av) )
                HasOnMouseMove++;

            if ( attrIsOnKEYDOWN(av) )
                HasOnMouseDown++;

            if ( attrIsOnKEYUP(av) )
                HasOnMouseUp++;

            if ( attrIsOnKEYPRESS(av) )
                HasOnClick++;

            if ( attrIsOnBLUR(av) )
                HasOnMouseOut++;
        }

        if ( HasOnMouseDown == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_DOWN);

        if ( HasOnMouseUp == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_UP);

        if ( HasOnClick == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_CLICK);
        if ( HasOnMouseOut == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OUT);

        if ( HasOnMouseOver == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OVER);

        if ( HasOnMouseMove == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_MOVE);

        /* Recursively check all child nodes.
         */
        for ( content = node->content; content != NULL; content = content->next )
            CheckScriptKeyboardAccessible( doc, content );
    }
}